

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qabstractitemmodel.cpp
# Opt level: O1

void QAbstractItemModel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  uint uVar1;
  long *plVar2;
  undefined1 uVar3;
  int iVar4;
  uint uVar5;
  offset_in_QAbstractItemModel_to_subr *candidate;
  undefined8 *puVar6;
  _func_int **pp_Var7;
  undefined4 uVar8;
  undefined4 *puVar9;
  void *pvVar10;
  void *pvVar11;
  qsizetype objectSize;
  QArrayData *data;
  QArrayDataPointer<QPersistentModelIndex> *pQVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  bool bVar14;
  bool bVar15;
  QArrayDataPointer<QPersistentModelIndex> local_78;
  undefined1 local_5c [20];
  QArrayDataPointer<QPersistentModelIndex> *local_48;
  QArrayDataPointer<QPersistentModelIndex> *pQStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == RegisterMethodArgumentMetaType) {
    if (_id == 0) {
      puVar6 = (undefined8 *)*_a;
      if (*_a[1] == 2) {
        *puVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<int>_>::metaType;
        goto LAB_0045c708;
      }
    }
    else {
      puVar6 = (undefined8 *)*_a;
    }
    *puVar6 = 0;
    goto LAB_0045c708;
  }
  if (_c == IndexOfMethod) {
    plVar2 = (long *)_a[1];
    if (((((((((code *)*plVar2 == dataChanged) && (uVar8 = 0, plVar2[1] == 0)) ||
            (((code *)*plVar2 == headerDataChanged && (uVar8 = 2, plVar2[1] == 0)))) ||
           (((code *)*plVar2 == layoutChanged && (uVar8 = 3, plVar2[1] == 0)))) ||
          (((code *)*plVar2 == layoutAboutToBeChanged && (uVar8 = 6, plVar2[1] == 0)))) ||
         (((((((code *)*plVar2 == rowsAboutToBeInserted && (uVar8 = 9, plVar2[1] == 0)) ||
             (((code *)*plVar2 == rowsInserted && (uVar8 = 10, plVar2[1] == 0)))) ||
            (((code *)*plVar2 == rowsAboutToBeRemoved && (uVar8 = 0xb, plVar2[1] == 0)))) ||
           (((code *)*plVar2 == rowsRemoved && (uVar8 = 0xc, plVar2[1] == 0)))) ||
          (((((code *)*plVar2 == columnsAboutToBeInserted && (uVar8 = 0xd, plVar2[1] == 0)) ||
            (((code *)*plVar2 == columnsInserted && (uVar8 = 0xe, plVar2[1] == 0)))) ||
           (((((code *)*plVar2 == columnsAboutToBeRemoved && (uVar8 = 0xf, plVar2[1] == 0)) ||
             (((code *)*plVar2 == columnsRemoved && (uVar8 = 0x10, plVar2[1] == 0)))) ||
            (((((code *)*plVar2 == modelAboutToBeReset && (uVar8 = 0x11, plVar2[1] == 0)) ||
              (((code *)*plVar2 == modelReset && (uVar8 = 0x12, plVar2[1] == 0)))) ||
             (((code *)*plVar2 == rowsAboutToBeMoved && (uVar8 = 0x13, plVar2[1] == 0)))))))))))) ||
        (((code *)*plVar2 == rowsMoved && (uVar8 = 0x14, plVar2[1] == 0)))) ||
       ((((code *)*plVar2 == columnsAboutToBeMoved && (uVar8 = 0x15, plVar2[1] == 0)) ||
        (((code *)*plVar2 == columnsMoved && (uVar8 = 0x16, plVar2[1] == 0)))))) {
      *(undefined4 *)*_a = uVar8;
    }
    goto LAB_0045c708;
  }
  if (_c != InvokeMetaMethod) goto LAB_0045c708;
  switch(_id) {
  case 0:
    pQStack_40 = (QArrayDataPointer<QPersistentModelIndex> *)_a[3];
    local_5c._12_8_ = _a[1];
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)_a[2];
    iVar4 = 0;
    goto LAB_0045c0e5;
  case 1:
    pQStack_40 = &local_78;
    local_78.d = (Data *)0x0;
    local_78.ptr = (QPersistentModelIndex *)0x0;
    local_78.size = 0;
    local_5c._4_8_ = (QArrayData *)0x0;
    local_5c._12_8_ = _a[1];
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)_a[2];
    QMetaObject::activate(_o,&staticMetaObject,0,(void **)(local_5c + 4));
    if (&(local_78.d)->super_QArrayData == (QArrayData *)0x0) break;
    LOCK();
    ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 0) break;
    objectSize = 4;
    data = &(local_78.d)->super_QArrayData;
    goto LAB_0045bebd;
  case 2:
    headerDataChanged((QAbstractItemModel *)_o,*_a[1],*_a[2],*_a[3]);
    break;
  case 3:
    local_5c._12_8_ = _a[1];
    local_78.d = (Data *)CONCAT44(local_78.d._4_4_,*_a[2]);
    goto LAB_0045be12;
  case 4:
    local_5c._12_8_ = _a[1];
    local_78.d = (Data *)((ulong)local_78.d._4_4_ << 0x20);
LAB_0045be12:
    local_48 = &local_78;
    iVar4 = 3;
    goto LAB_0045c0e5;
  case 5:
    local_5c._12_8_ = &local_78;
    local_78.d = (Data *)0x0;
    local_78.ptr = (QPersistentModelIndex *)0x0;
    local_78.size = 0;
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)local_5c;
    local_5c._0_4_ = 0;
    local_5c._4_8_ = (QArrayData *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,3,(void **)(local_5c + 4));
    goto LAB_0045c156;
  case 6:
    local_5c._12_8_ = _a[1];
    local_78.d = (Data *)CONCAT44(local_78.d._4_4_,*_a[2]);
    goto LAB_0045c088;
  case 7:
    local_5c._12_8_ = _a[1];
    local_78.d = (Data *)((ulong)local_78.d._4_4_ << 0x20);
LAB_0045c088:
    local_48 = &local_78;
    iVar4 = 6;
    goto LAB_0045c0e5;
  case 8:
    local_5c._12_8_ = &local_78;
    local_78.d = (Data *)0x0;
    local_78.ptr = (QPersistentModelIndex *)0x0;
    local_78.size = 0;
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)local_5c;
    local_5c._0_4_ = 0;
    local_5c._4_8_ = (QArrayData *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,6,(void **)(local_5c + 4));
LAB_0045c156:
    QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer(&local_78);
    break;
  case 9:
    rowsAboutToBeInserted((QAbstractItemModel *)_o,_a[1],*_a[2],*_a[3]);
    break;
  case 10:
    rowsInserted((QAbstractItemModel *)_o,_a[1],*_a[2],*_a[3]);
    break;
  case 0xb:
    rowsAboutToBeRemoved((QAbstractItemModel *)_o,_a[1],*_a[2],*_a[3]);
    break;
  case 0xc:
    rowsRemoved((QAbstractItemModel *)_o,_a[1],*_a[2],*_a[3]);
    break;
  case 0xd:
    columnsAboutToBeInserted((QAbstractItemModel *)_o,_a[1],*_a[2],*_a[3]);
    break;
  case 0xe:
    columnsInserted((QAbstractItemModel *)_o,_a[1],*_a[2],*_a[3]);
    break;
  case 0xf:
    columnsAboutToBeRemoved((QAbstractItemModel *)_o,_a[1],*_a[2],*_a[3]);
    break;
  case 0x10:
    columnsRemoved((QAbstractItemModel *)_o,_a[1],*_a[2],*_a[3]);
    break;
  case 0x11:
    local_5c._12_8_ = &local_78;
    iVar4 = 0x11;
    goto LAB_0045c0e5;
  case 0x12:
    local_5c._12_8_ = &local_78;
    iVar4 = 0x12;
LAB_0045c0e5:
    local_5c._4_8_ = (QArrayData *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar4,(void **)(local_5c + 4));
    break;
  case 0x13:
    rowsAboutToBeMoved((QAbstractItemModel *)_o,_a[1],*_a[2],*_a[3],_a[4],*_a[5]);
    break;
  case 0x14:
    rowsMoved((QAbstractItemModel *)_o,_a[1],*_a[2],*_a[3],_a[4],*_a[5]);
    break;
  case 0x15:
    columnsAboutToBeMoved((QAbstractItemModel *)_o,_a[1],*_a[2],*_a[3],_a[4],*_a[5]);
    break;
  case 0x16:
    columnsMoved((QAbstractItemModel *)_o,_a[1],*_a[2],*_a[3],_a[4],*_a[5]);
    break;
  case 0x17:
    iVar4 = (*_o->_vptr_QObject[0x2e])(_o);
    uVar3 = (undefined1)iVar4;
    goto LAB_0045c4d8;
  case 0x18:
    (*_o->_vptr_QObject[0x2f])(_o);
    break;
  case 0x19:
    (*_o->_vptr_QObject[0x30])(_o);
    break;
  case 0x1a:
    uVar5 = *_a[1];
    uVar1 = *_a[2];
    if (-1 < (int)(uVar1 | uVar5)) {
      pvVar11 = _a[3];
      iVar4 = (*_o->_vptr_QObject[0xf])(_o);
      if ((int)uVar5 < iVar4) {
        uVar5 = (*_o->_vptr_QObject[0x10])(_o,pvVar11);
        bVar15 = SBORROW4(uVar5,uVar1);
        iVar4 = uVar5 - uVar1;
        bVar14 = uVar5 == uVar1;
        goto LAB_0045c414;
      }
    }
LAB_0045c419:
    bVar14 = false;
    goto LAB_0045c41b;
  case 0x1b:
    uVar5 = *_a[1];
    uVar1 = *_a[2];
    local_5c._4_8_ = (QArrayData *)0xffffffffffffffff;
    local_5c._12_8_ = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
    if (((int)(uVar1 | uVar5) < 0) ||
       (iVar4 = (*_o->_vptr_QObject[0xf])(_o,local_5c + 4), iVar4 <= (int)uVar5)) goto LAB_0045c419;
    uVar5 = (*_o->_vptr_QObject[0x10])(_o,local_5c + 4);
    bVar15 = SBORROW4(uVar5,uVar1);
    iVar4 = uVar5 - uVar1;
    bVar14 = uVar5 == uVar1;
LAB_0045c414:
    bVar14 = !bVar14 && bVar15 == iVar4 < 0;
LAB_0045c41b:
    if (*_a != (void *)0x0) {
      *(bool *)*_a = bVar14;
    }
    break;
  case 0x1c:
    uVar5 = *_a[1];
    uVar1 = *_a[2];
    pQVar12 = (QArrayDataPointer<QPersistentModelIndex> *)_a[3];
    goto LAB_0045c35e;
  case 0x1d:
    uVar5 = *_a[1];
    uVar1 = *_a[2];
    pQVar12 = &local_78;
    local_78.d = (Data *)0xffffffffffffffff;
    local_78.ptr = (QPersistentModelIndex *)0x0;
    local_78.size = 0;
LAB_0045c35e:
    local_5c._12_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_5c._4_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)&DAT_aaaaaaaaaaaaaaaa;
    (*_o->_vptr_QObject[0xc])(local_5c + 4,_o,(ulong)uVar5,(ulong)uVar1,pQVar12);
    goto LAB_0045c367;
  case 0x1e:
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)&DAT_aaaaaaaaaaaaaaaa;
    local_5c._4_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_5c._12_8_ = &DAT_aaaaaaaaaaaaaaaa;
    (*_o->_vptr_QObject[0xd])(local_5c + 4,_o,_a[1]);
    goto LAB_0045c367;
  case 0x1f:
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)&DAT_aaaaaaaaaaaaaaaa;
    local_5c._4_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_5c._12_8_ = &DAT_aaaaaaaaaaaaaaaa;
    (*_o->_vptr_QObject[0xe])(local_5c + 4,_o,(ulong)*_a[1],(ulong)*_a[2],_a[3]);
LAB_0045c367:
    puVar6 = (undefined8 *)*_a;
    if (puVar6 != (undefined8 *)0x0) {
      puVar6[2] = local_48;
      *puVar6 = local_5c._4_8_;
      puVar6[1] = local_5c._12_8_;
    }
    break;
  case 0x20:
    puVar9 = (undefined4 *)_a[1];
    goto LAB_0045c198;
  case 0x21:
    puVar9 = (undefined4 *)(local_5c + 4);
    local_5c._4_8_ = (QArrayData *)0xffffffffffffffff;
    local_5c._12_8_ = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
LAB_0045c198:
    iVar4 = (*_o->_vptr_QObject[0xf])(_o,puVar9);
LAB_0045c1a1:
    if ((int *)*_a != (int *)0x0) {
      *(int *)*_a = iVar4;
    }
    break;
  case 0x22:
    puVar9 = (undefined4 *)_a[1];
    goto LAB_0045bbf6;
  case 0x23:
    puVar9 = (undefined4 *)(local_5c + 4);
    local_5c._4_8_ = (QArrayData *)0xffffffffffffffff;
    local_5c._12_8_ = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
LAB_0045bbf6:
    iVar4 = (*_o->_vptr_QObject[0x10])(_o,puVar9);
    goto LAB_0045c1a1;
  case 0x24:
    puVar9 = (undefined4 *)_a[1];
    goto LAB_0045bb06;
  case 0x25:
    puVar9 = (undefined4 *)(local_5c + 4);
    local_5c._4_8_ = (QArrayData *)0xffffffffffffffff;
    local_5c._12_8_ = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
LAB_0045bb06:
    iVar4 = (*_o->_vptr_QObject[0x11])(_o,puVar9);
    uVar3 = (undefined1)iVar4;
    goto LAB_0045c4d8;
  case 0x26:
    pvVar11 = _a[1];
    uVar13 = (ulong)*_a[2];
    pp_Var7 = _o->_vptr_QObject;
    goto LAB_0045c3ac;
  case 0x27:
    pvVar11 = _a[1];
    pp_Var7 = _o->_vptr_QObject;
    uVar13 = 0;
LAB_0045c3ac:
    pQStack_40 = (QArrayDataPointer<QPersistentModelIndex> *)&DAT_aaaaaaaaaaaaaaaa;
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)&DAT_aaaaaaaaaaaaaaaa;
    local_5c._12_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_5c._4_8_ = &DAT_aaaaaaaaaaaaaaaa;
    (*pp_Var7[0x12])(local_5c + 4,_o,pvVar11,uVar13);
LAB_0045c3b2:
    if ((QVariant *)*_a != (QVariant *)0x0) {
      ::QVariant::operator=((QVariant *)*_a,(QVariant *)(local_5c + 4));
    }
    ::QVariant::~QVariant((QVariant *)(local_5c + 4));
    break;
  case 0x28:
    pvVar11 = _a[1];
    pvVar10 = _a[2];
    uVar13 = (ulong)*_a[3];
    pp_Var7 = _o->_vptr_QObject;
    goto LAB_0045bf4d;
  case 0x29:
    pvVar11 = _a[1];
    pvVar10 = _a[2];
    pp_Var7 = _o->_vptr_QObject;
    uVar13 = 2;
LAB_0045bf4d:
    iVar4 = (*pp_Var7[0x13])(_o,pvVar11,pvVar10,uVar13);
    uVar3 = (undefined1)iVar4;
    goto LAB_0045c4d8;
  case 0x2a:
    uVar1 = *_a[1];
    uVar5 = *_a[2];
    uVar13 = (ulong)*_a[3];
    pp_Var7 = _o->_vptr_QObject;
    goto LAB_0045c2a7;
  case 0x2b:
    uVar1 = *_a[1];
    uVar5 = *_a[2];
    pp_Var7 = _o->_vptr_QObject;
    uVar13 = 0;
LAB_0045c2a7:
    pQStack_40 = (QArrayDataPointer<QPersistentModelIndex> *)&DAT_aaaaaaaaaaaaaaaa;
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)&DAT_aaaaaaaaaaaaaaaa;
    local_5c._12_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_5c._4_8_ = &DAT_aaaaaaaaaaaaaaaa;
    (*pp_Var7[0x14])(local_5c + 4,_o,(ulong)uVar1,(ulong)uVar5,uVar13);
    goto LAB_0045c3b2;
  case 0x2c:
    uVar5 = *_a[1];
    uVar1 = *_a[2];
    puVar9 = (undefined4 *)_a[3];
    goto LAB_0045c1d3;
  case 0x2d:
    uVar5 = *_a[1];
    uVar1 = *_a[2];
    puVar9 = (undefined4 *)(local_5c + 4);
    local_5c._4_8_ = (QArrayData *)0xffffffffffffffff;
    local_5c._12_8_ = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
LAB_0045c1d3:
    uVar13 = (ulong)uVar1;
    pp_Var7 = _o->_vptr_QObject;
LAB_0045c45e:
    iVar4 = (*pp_Var7[0x1f])(_o,(ulong)uVar5,uVar13,puVar9);
    uVar3 = (undefined1)iVar4;
    goto LAB_0045c4d8;
  case 0x2e:
    uVar5 = *_a[1];
    uVar1 = *_a[2];
    puVar9 = (undefined4 *)_a[3];
    goto LAB_0045c49f;
  case 0x2f:
    uVar5 = *_a[1];
    uVar1 = *_a[2];
    puVar9 = (undefined4 *)(local_5c + 4);
    local_5c._4_8_ = (QArrayData *)0xffffffffffffffff;
    local_5c._12_8_ = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
LAB_0045c49f:
    uVar13 = (ulong)uVar1;
    pp_Var7 = _o->_vptr_QObject;
LAB_0045c4a5:
    iVar4 = (*pp_Var7[0x20])(_o,(ulong)uVar5,uVar13,puVar9);
    uVar3 = (undefined1)iVar4;
    goto LAB_0045c4d8;
  case 0x30:
    uVar5 = *_a[1];
    uVar1 = *_a[2];
    puVar9 = (undefined4 *)_a[3];
    goto LAB_0045bce2;
  case 0x31:
    uVar5 = *_a[1];
    uVar1 = *_a[2];
    puVar9 = (undefined4 *)(local_5c + 4);
    local_5c._4_8_ = (QArrayData *)0xffffffffffffffff;
    local_5c._12_8_ = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
LAB_0045bce2:
    uVar13 = (ulong)uVar1;
    pp_Var7 = _o->_vptr_QObject;
LAB_0045c2d6:
    iVar4 = (*pp_Var7[0x21])(_o,(ulong)uVar5,uVar13,puVar9);
    uVar3 = (undefined1)iVar4;
    goto LAB_0045c4d8;
  case 0x32:
    uVar5 = *_a[1];
    uVar1 = *_a[2];
    puVar9 = (undefined4 *)_a[3];
    goto LAB_0045c4cc;
  case 0x33:
    uVar5 = *_a[1];
    uVar1 = *_a[2];
    puVar9 = (undefined4 *)(local_5c + 4);
    local_5c._4_8_ = (QArrayData *)0xffffffffffffffff;
    local_5c._12_8_ = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
LAB_0045c4cc:
    uVar13 = (ulong)uVar1;
    pp_Var7 = _o->_vptr_QObject;
LAB_0045c4d2:
    iVar4 = (*pp_Var7[0x22])(_o,(ulong)uVar5,uVar13,puVar9);
    uVar3 = (undefined1)iVar4;
    goto LAB_0045c4d8;
  case 0x34:
    pvVar11 = _a[1];
    uVar1 = *_a[2];
    uVar13 = (ulong)*_a[3];
    pvVar10 = _a[4];
    uVar5 = *_a[5];
    pp_Var7 = _o->_vptr_QObject;
    goto LAB_0045c487;
  case 0x35:
    pvVar11 = _a[1];
    uVar5 = *_a[2];
    uVar13 = (ulong)*_a[3];
    pvVar10 = _a[4];
    uVar1 = *_a[5];
    pp_Var7 = _o->_vptr_QObject;
    goto LAB_0045bdf6;
  case 0x36:
    puVar9 = (undefined4 *)_a[2];
    uVar5 = *_a[1];
    goto LAB_0045c453;
  case 0x37:
    uVar5 = *_a[1];
    puVar9 = (undefined4 *)(local_5c + 4);
    local_5c._4_8_ = (QArrayData *)0xffffffffffffffff;
    local_5c._12_8_ = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
LAB_0045c453:
    pp_Var7 = _o->_vptr_QObject;
    uVar13 = 1;
    goto LAB_0045c45e;
  case 0x38:
    puVar9 = (undefined4 *)_a[2];
    uVar5 = *_a[1];
    goto LAB_0045c26b;
  case 0x39:
    uVar5 = *_a[1];
    puVar9 = (undefined4 *)(local_5c + 4);
    local_5c._4_8_ = (QArrayData *)0xffffffffffffffff;
    local_5c._12_8_ = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
LAB_0045c26b:
    pp_Var7 = _o->_vptr_QObject;
    uVar13 = 1;
    goto LAB_0045c4a5;
  case 0x3a:
    puVar9 = (undefined4 *)_a[2];
    uVar5 = *_a[1];
    goto LAB_0045c2cb;
  case 0x3b:
    uVar5 = *_a[1];
    puVar9 = (undefined4 *)(local_5c + 4);
    local_5c._4_8_ = (QArrayData *)0xffffffffffffffff;
    local_5c._12_8_ = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
LAB_0045c2cb:
    pp_Var7 = _o->_vptr_QObject;
    uVar13 = 1;
    goto LAB_0045c2d6;
  case 0x3c:
    puVar9 = (undefined4 *)_a[2];
    uVar5 = *_a[1];
    goto LAB_0045bf99;
  case 0x3d:
    uVar5 = *_a[1];
    puVar9 = (undefined4 *)(local_5c + 4);
    local_5c._4_8_ = (QArrayData *)0xffffffffffffffff;
    local_5c._12_8_ = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
LAB_0045bf99:
    pp_Var7 = _o->_vptr_QObject;
    uVar13 = 1;
    goto LAB_0045c4d2;
  case 0x3e:
    pvVar11 = _a[1];
    uVar1 = *_a[2];
    pvVar10 = _a[3];
    uVar5 = *_a[4];
    pp_Var7 = _o->_vptr_QObject;
    uVar13 = 1;
LAB_0045c487:
    iVar4 = (*pp_Var7[0x23])(_o,pvVar11,(ulong)uVar1,uVar13,pvVar10,(ulong)uVar5);
    uVar3 = (undefined1)iVar4;
    goto LAB_0045c4d8;
  case 0x3f:
    pvVar11 = _a[1];
    uVar5 = *_a[2];
    pvVar10 = _a[3];
    uVar1 = *_a[4];
    pp_Var7 = _o->_vptr_QObject;
    uVar13 = 1;
LAB_0045bdf6:
    iVar4 = (*pp_Var7[0x24])(_o,pvVar11,(ulong)uVar5,uVar13,pvVar10,(ulong)uVar1);
    uVar3 = (undefined1)iVar4;
    goto LAB_0045c4d8;
  case 0x40:
    (*_o->_vptr_QObject[0x25])(_o,_a[1]);
    break;
  case 0x41:
    iVar4 = (*_o->_vptr_QObject[0x26])(_o,_a[1]);
    uVar3 = (undefined1)iVar4;
LAB_0045c4d8:
    if ((undefined1 *)*_a != (undefined1 *)0x0) {
      *(undefined1 *)*_a = uVar3;
    }
    break;
  case 0x42:
    iVar4 = (*_o->_vptr_QObject[0x27])(_o,_a[1]);
    goto LAB_0045c1a1;
  case 0x43:
    uVar5 = *_a[1];
    uVar13 = (ulong)*_a[2];
    pp_Var7 = _o->_vptr_QObject;
    goto LAB_0045c735;
  case 0x44:
    uVar5 = *_a[1];
    pp_Var7 = _o->_vptr_QObject;
    uVar13 = 0;
LAB_0045c735:
    (*pp_Var7[0x28])(_o,(ulong)uVar5,uVar13);
    break;
  case 0x45:
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)&DAT_aaaaaaaaaaaaaaaa;
    local_5c._4_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_5c._12_8_ = &DAT_aaaaaaaaaaaaaaaa;
    (*_o->_vptr_QObject[0x2a])(local_5c + 4,_o,_a[1],(ulong)*_a[2],_a[3],(ulong)*_a[4],*_a[5]);
    goto LAB_0045bb5f;
  case 0x46:
    pvVar11 = _a[1];
    uVar5 = *_a[2];
    pvVar10 = _a[3];
    uVar13 = (ulong)*_a[4];
    pp_Var7 = _o->_vptr_QObject;
    goto LAB_0045ba71;
  case 0x47:
    pvVar11 = _a[1];
    uVar5 = *_a[2];
    pvVar10 = _a[3];
    pp_Var7 = _o->_vptr_QObject;
    uVar13 = 1;
LAB_0045ba71:
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)&DAT_aaaaaaaaaaaaaaaa;
    local_5c._12_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_5c._4_8_ = &DAT_aaaaaaaaaaaaaaaa;
    (*pp_Var7[0x2a])(local_5c + 4,_o,pvVar11,(ulong)uVar5,pvVar10,uVar13,0x22);
LAB_0045bb5f:
    if ((QArrayDataPointer<QModelIndex> *)*_a != (QArrayDataPointer<QModelIndex> *)0x0) {
      QArrayDataPointer<QModelIndex>::operator=
                ((QArrayDataPointer<QModelIndex> *)*_a,
                 (QArrayDataPointer<QModelIndex> *)(local_5c + 4));
    }
    if ((QArrayData *)local_5c._4_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_5c._4_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_5c._4_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_5c._4_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        objectSize = 0x18;
        data = (QArrayData *)local_5c._4_8_;
LAB_0045bebd:
        QArrayData::deallocate(data,objectSize,0x10);
      }
    }
  }
LAB_0045c708:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemModel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QAbstractItemModel *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->dataChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QList<int>>>(_a[3]))); break;
        case 1: _t->dataChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2]))); break;
        case 2: _t->headerDataChanged((*reinterpret_cast< std::add_pointer_t<Qt::Orientation>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 3: _t->layoutChanged((*reinterpret_cast< std::add_pointer_t<QList<QPersistentModelIndex>>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAbstractItemModel::LayoutChangeHint>>(_a[2]))); break;
        case 4: _t->layoutChanged((*reinterpret_cast< std::add_pointer_t<QList<QPersistentModelIndex>>>(_a[1]))); break;
        case 5: _t->layoutChanged(); break;
        case 6: _t->layoutAboutToBeChanged((*reinterpret_cast< std::add_pointer_t<QList<QPersistentModelIndex>>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAbstractItemModel::LayoutChangeHint>>(_a[2]))); break;
        case 7: _t->layoutAboutToBeChanged((*reinterpret_cast< std::add_pointer_t<QList<QPersistentModelIndex>>>(_a[1]))); break;
        case 8: _t->layoutAboutToBeChanged(); break;
        case 9: _t->rowsAboutToBeInserted((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])), QPrivateSignal()); break;
        case 10: _t->rowsInserted((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])), QPrivateSignal()); break;
        case 11: _t->rowsAboutToBeRemoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])), QPrivateSignal()); break;
        case 12: _t->rowsRemoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])), QPrivateSignal()); break;
        case 13: _t->columnsAboutToBeInserted((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])), QPrivateSignal()); break;
        case 14: _t->columnsInserted((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])), QPrivateSignal()); break;
        case 15: _t->columnsAboutToBeRemoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])), QPrivateSignal()); break;
        case 16: _t->columnsRemoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])), QPrivateSignal()); break;
        case 17: _t->modelAboutToBeReset(QPrivateSignal()); break;
        case 18: _t->modelReset(QPrivateSignal()); break;
        case 19: _t->rowsAboutToBeMoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[4])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[5])), QPrivateSignal()); break;
        case 20: _t->rowsMoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[4])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[5])), QPrivateSignal()); break;
        case 21: _t->columnsAboutToBeMoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[4])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[5])), QPrivateSignal()); break;
        case 22: _t->columnsMoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[4])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[5])), QPrivateSignal()); break;
        case 23: { bool _r = _t->submit();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 24: _t->revert(); break;
        case 25: _t->resetInternalData(); break;
        case 26: { bool _r = _t->hasIndex((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[3])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 27: { bool _r = _t->hasIndex((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 28: { QModelIndex _r = _t->index((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[3])));
            if (_a[0]) *reinterpret_cast< QModelIndex*>(_a[0]) = std::move(_r); }  break;
        case 29: { QModelIndex _r = _t->index((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QModelIndex*>(_a[0]) = std::move(_r); }  break;
        case 30: { QModelIndex _r = _t->parent((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QModelIndex*>(_a[0]) = std::move(_r); }  break;
        case 31: { QModelIndex _r = _t->sibling((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[3])));
            if (_a[0]) *reinterpret_cast< QModelIndex*>(_a[0]) = std::move(_r); }  break;
        case 32: { int _r = _t->rowCount((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])));
            if (_a[0]) *reinterpret_cast< int*>(_a[0]) = std::move(_r); }  break;
        case 33: { int _r = _t->rowCount();
            if (_a[0]) *reinterpret_cast< int*>(_a[0]) = std::move(_r); }  break;
        case 34: { int _r = _t->columnCount((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])));
            if (_a[0]) *reinterpret_cast< int*>(_a[0]) = std::move(_r); }  break;
        case 35: { int _r = _t->columnCount();
            if (_a[0]) *reinterpret_cast< int*>(_a[0]) = std::move(_r); }  break;
        case 36: { bool _r = _t->hasChildren((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 37: { bool _r = _t->hasChildren();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 38: { QVariant _r = _t->data((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        case 39: { QVariant _r = _t->data((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        case 40: { bool _r = _t->setData((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 41: { bool _r = _t->setData((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 42: { QVariant _r = _t->headerData((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<Qt::Orientation>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        case 43: { QVariant _r = _t->headerData((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<Qt::Orientation>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        case 44: { bool _r = _t->insertRows((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[3])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 45: { bool _r = _t->insertRows((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 46: { bool _r = _t->insertColumns((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[3])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 47: { bool _r = _t->insertColumns((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 48: { bool _r = _t->removeRows((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[3])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 49: { bool _r = _t->removeRows((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 50: { bool _r = _t->removeColumns((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[3])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 51: { bool _r = _t->removeColumns((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 52: { bool _r = _t->moveRows((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[4])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[5])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 53: { bool _r = _t->moveColumns((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[4])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[5])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 54: { bool _r = _t->insertRow((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 55: { bool _r = _t->insertRow((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 56: { bool _r = _t->insertColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 57: { bool _r = _t->insertColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 58: { bool _r = _t->removeRow((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 59: { bool _r = _t->removeRow((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 60: { bool _r = _t->removeColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 61: { bool _r = _t->removeColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 62: { bool _r = _t->moveRow((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[4])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 63: { bool _r = _t->moveColumn((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[4])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 64: _t->fetchMore((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 65: { bool _r = _t->canFetchMore((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 66: { Qt::ItemFlags _r = _t->flags((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])));
            if (_a[0]) *reinterpret_cast< Qt::ItemFlags*>(_a[0]) = std::move(_r); }  break;
        case 67: _t->sort((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<Qt::SortOrder>>(_a[2]))); break;
        case 68: _t->sort((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 69: { QModelIndexList _r = _t->match((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[4])),(*reinterpret_cast< std::add_pointer_t<Qt::MatchFlags>>(_a[5])));
            if (_a[0]) *reinterpret_cast< QModelIndexList*>(_a[0]) = std::move(_r); }  break;
        case 70: { QModelIndexList _r = _t->match((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[4])));
            if (_a[0]) *reinterpret_cast< QModelIndexList*>(_a[0]) = std::move(_r); }  break;
        case 71: { QModelIndexList _r = _t->match((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[3])));
            if (_a[0]) *reinterpret_cast< QModelIndexList*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 2:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<int> >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , const QModelIndex & , const QList<int> & )>(_a, &QAbstractItemModel::dataChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(Qt::Orientation , int , int )>(_a, &QAbstractItemModel::headerDataChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QList<QPersistentModelIndex> & , QAbstractItemModel::LayoutChangeHint )>(_a, &QAbstractItemModel::layoutChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QList<QPersistentModelIndex> & , QAbstractItemModel::LayoutChangeHint )>(_a, &QAbstractItemModel::layoutAboutToBeChanged, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , QPrivateSignal)>(_a, &QAbstractItemModel::rowsAboutToBeInserted, 9))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , QPrivateSignal)>(_a, &QAbstractItemModel::rowsInserted, 10))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , QPrivateSignal)>(_a, &QAbstractItemModel::rowsAboutToBeRemoved, 11))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , QPrivateSignal)>(_a, &QAbstractItemModel::rowsRemoved, 12))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , QPrivateSignal)>(_a, &QAbstractItemModel::columnsAboutToBeInserted, 13))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , QPrivateSignal)>(_a, &QAbstractItemModel::columnsInserted, 14))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , QPrivateSignal)>(_a, &QAbstractItemModel::columnsAboutToBeRemoved, 15))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , QPrivateSignal)>(_a, &QAbstractItemModel::columnsRemoved, 16))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(QPrivateSignal)>(_a, &QAbstractItemModel::modelAboutToBeReset, 17))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(QPrivateSignal)>(_a, &QAbstractItemModel::modelReset, 18))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , const QModelIndex & , int , QPrivateSignal)>(_a, &QAbstractItemModel::rowsAboutToBeMoved, 19))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , const QModelIndex & , int , QPrivateSignal)>(_a, &QAbstractItemModel::rowsMoved, 20))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , const QModelIndex & , int , QPrivateSignal)>(_a, &QAbstractItemModel::columnsAboutToBeMoved, 21))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , const QModelIndex & , int , QPrivateSignal)>(_a, &QAbstractItemModel::columnsMoved, 22))
            return;
    }
}